

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O2

void __thiscall
vkt::pipeline::anon_unknown_0::PipelineFromCacheTestInstance::~PipelineFromCacheTestInstance
          (PipelineFromCacheTestInstance *this)

{
  (this->super_GraphicsCacheTestInstance).super_CacheTestInstance.super_TestInstance.
  _vptr_TestInstance = (_func_int **)&PTR__PipelineFromCacheTestInstance_00bfa430;
  if (this->m_data != (deUint8 *)0x0) {
    operator_delete__(this->m_data);
  }
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)15>_>::~RefBase
            (&(this->m_newCache).super_RefBase<vk::Handle<(vk::HandleType)15>_>);
  GraphicsCacheTestInstance::~GraphicsCacheTestInstance(&this->super_GraphicsCacheTestInstance);
  return;
}

Assistant:

PipelineFromCacheTestInstance::~PipelineFromCacheTestInstance (void)
{
	delete[] m_data;
}